

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O1

void __thiscall MeasurementToString_empty_Test::TestBody(MeasurementToString_empty_Test *this)

{
  measurement *measure;
  uint64_t in_RCX;
  char *message;
  AssertionResult gtest_ar;
  measurement m1;
  AssertHelper AStack_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string local_40;
  undefined8 local_20;
  undefined8 local_18;
  
  local_20 = 0x4046d9999999999a;
  local_18 = 0x3f800000;
  measure = (measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_40,(units *)&local_20,measure,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_50,"to_string(m1)","\"45.7\"",&local_40,(char (*) [5])"45.7");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x88,message);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST(MeasurementToString, empty)
{
    measurement m1(45.7, one);
    EXPECT_EQ(to_string(m1), "45.7");
}